

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rply.cpp
# Opt level: O0

int ply_read_header(p_ply ply)

{
  int iVar1;
  p_ply in_RDI;
  p_ply in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  iVar1 = ply_read_header_magic
                    ((p_ply)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
  if ((iVar1 != 0) && (iVar1 = ply_read_word(in_stack_ffffffffffffffe8), iVar1 != 0)) {
    iVar1 = ply_read_header_format(in_stack_ffffffffffffffe8);
    if (iVar1 == 0) {
      ply_ferror(in_RDI,"Invalid file format");
    }
    else {
      do {
        iVar1 = strcmp(in_RDI->buffer + in_RDI->buffer_token,"end_header");
        if (iVar1 == 0) {
          if (in_RDI->rn != 0) {
            if ((in_RDI->buffer_last == in_RDI->buffer_first) &&
               (iVar1 = BREFILL(in_stack_ffffffffffffffe8), iVar1 == 0)) {
              ply_ferror(in_RDI,"Unexpected end of file");
              return 0;
            }
            in_RDI->buffer_first = in_RDI->buffer_first + 1;
          }
          return 1;
        }
        iVar1 = ply_read_header_comment(in_stack_ffffffffffffffe8);
      } while (((iVar1 != 0) ||
               (iVar1 = ply_read_header_element
                                  ((p_ply)CONCAT44(in_stack_fffffffffffffffc,
                                                   in_stack_fffffffffffffff8)), iVar1 != 0)) ||
              (iVar1 = ply_read_header_obj_info(in_stack_ffffffffffffffe8), iVar1 != 0));
      ply_ferror(in_RDI,"Unexpected token \'%s\'",in_RDI->buffer + in_RDI->buffer_token);
    }
  }
  return 0;
}

Assistant:

int ply_read_header(p_ply ply) {
    assert(ply && (ply->fp || ply->gzfp) && ply->io_mode == PLY_READ);
    if (!ply_read_header_magic(ply)) return 0;
    if (!ply_read_word(ply)) return 0;
    /* parse file format */
    if (!ply_read_header_format(ply)) {
        ply_ferror(ply, "Invalid file format");
        return 0;
    }
    /* parse elements, comments or obj_infos until the end of header */
    while (strcmp(BWORD(ply), "end_header")) {
        if (!ply_read_header_comment(ply) && !ply_read_header_element(ply) &&
            !ply_read_header_obj_info(ply)) {
            ply_ferror(ply, "Unexpected token '%s'", BWORD(ply));
            return 0;
        }
    }
    /* skip extra character? */
    if (ply->rn) {
        if (BSIZE(ply) < 1 && !BREFILL(ply)) {
            ply_ferror(ply, "Unexpected end of file");
            return 0;
        }
        BSKIP(ply, 1);
    }
    return 1;
}